

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O0

int __thiscall JetHead::Socket::checkSocketHealth(Socket *this,uint32_t thresholdSeconds)

{
  int iVar1;
  socklen_t local_90;
  undefined1 local_8c [2];
  byte local_8a;
  byte local_89;
  socklen_t info_len;
  tcp_info info;
  uint32_t i;
  uint8_t thresholdMagnitude;
  uint32_t thresholdSeconds_local;
  Socket *this_local;
  
  info.tcpi_total_retrans._3_1_ = 0;
  for (info.tcpi_rcv_space = thresholdSeconds; 1 < info.tcpi_rcv_space;
      info.tcpi_rcv_space = info.tcpi_rcv_space >> 1) {
    info.tcpi_total_retrans._3_1_ = info.tcpi_total_retrans._3_1_ + 1;
  }
  local_90 = 0x68;
  iVar1 = getsockopt(this->mFd,6,0xb,local_8c,&local_90);
  if (iVar1 == 0) {
    if ((info.tcpi_total_retrans._3_1_ + 1 < (uint)local_8a) &&
       (thresholdSeconds * 1000 < info.tcpi_last_ack_sent)) {
      jh_log_print(0,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x2f2,"failed for retransmits %d",(ulong)local_8a);
      jh_log_print(2,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x2f4,"last_ack_recv %d, backoff %d",(ulong)info.tcpi_last_ack_sent,
                   (uint)(byte)info_len);
      this_local._4_4_ = info.tcpi_last_ack_sent / 1000;
    }
    else if ((local_89 == 0) ||
            (((uint)local_89 + (uint)(byte)info_len <= (uint)info.tcpi_total_retrans._3_1_ * 2 ||
             (info.tcpi_last_ack_sent <= thresholdSeconds * 1000)))) {
      this_local._4_4_ = 0;
    }
    else {
      jh_log_print(0,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x300,"failed for probes %d",(ulong)local_89);
      jh_log_print(2,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                   ,0x302,"last_ack_recv %d, backoff %d",(ulong)info.tcpi_last_ack_sent,
                   (uint)(byte)info_len);
      this_local._4_4_ = info.tcpi_last_ack_sent / 1000;
    }
  }
  else {
    jh_log_print(3,"int JetHead::Socket::checkSocketHealth(uint32_t)",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/benpayne[P]jhcommon/src/Socket.cpp"
                 ,0x2e7,"failed to getsockopt TCP_INFO");
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int Socket::checkSocketHealth(uint32_t thresholdSeconds)
{
#ifdef PLATFORM_DARWIN
	return 0;
#else
	// Compute the log of the thresholdSeconds for use below
	uint8_t thresholdMagnitude = 0;
	for (uint32_t i = thresholdSeconds; i > 1; i /= 2, ++thresholdMagnitude);

	struct tcp_info info;
	socklen_t info_len = sizeof(info);

	if ( getsockopt(mFd, IPPROTO_TCP, TCP_INFO, &info, &info_len) )
	{
		LOG_WARN_PERROR("failed to getsockopt TCP_INFO");
		return -1;
	}

	// For the "sending" state: see if the number of outstanding
	// retransmits currently exceeds one more than the magnitude of
	// the threshold and if the last ack we have received from the
	// client is older than the threshold
	if (info.tcpi_retransmits > thresholdMagnitude + 1 &&
		info.tcpi_last_ack_recv > thresholdSeconds * 1000)
	{
		LOG_ERR("failed for retransmits %d", info.tcpi_retransmits);
		LOG_WARN("last_ack_recv %d, backoff %d",
				 info.tcpi_last_ack_recv, info.tcpi_backoff);
		return info.tcpi_last_ack_recv / 1000;
	}
	// For the "zero-window probe" state: See if we have missed any
	// probes, and if the total of missed probes and the backoff
	// exceeds twice the magnitude of the of the threshold, and if the
	// last ack we have received from the client is older than the
	// threshold
	if (info.tcpi_probes > 0 &&
		info.tcpi_probes + info.tcpi_backoff > thresholdMagnitude * 2 &&
		info.tcpi_last_ack_recv > thresholdSeconds * 1000)
	{
		LOG_ERR("failed for probes %d", info.tcpi_probes);
		LOG_WARN("last_ack_recv %d, backoff %d",
				 info.tcpi_last_ack_recv, info.tcpi_backoff);
		return info.tcpi_last_ack_recv / 1000;
	}
	
	// Socket health looks good *or* anything bad is still under threshold
	return 0;
#endif
}